

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-utils.h
# Opt level: O0

int clz64(uint64_t val)

{
  long lVar1;
  undefined4 local_14;
  uint64_t val_local;
  
  if (val == 0) {
    local_14 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (val != 0) {
      for (; val >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_14 = (uint)lVar1 ^ 0x3f;
  }
  return local_14;
}

Assistant:

static inline int clz64(uint64_t val)
{
#ifndef _MSC_VER
    return val ? __builtin_clzll(val) : 64;
#else
    int cnt = 0;

    if (!(val >> 32)) {
        cnt += 32;
    } else {
        val >>= 32;
    }

    return cnt + clz32((uint32_t)val);
#endif
}